

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

ALfilter * anon_unknown.dwarf_41b5d::LookupFilter(ALCdevice *device,ALuint id)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  uint64_t uVar5;
  int in_ESI;
  long in_RDI;
  FilterSubList *sublist;
  ALuint slidx;
  size_t lidx;
  ALfilter *local_8;
  
  uVar2 = (ulong)(in_ESI - 1U >> 6);
  uVar1 = in_ESI - 1U & 0x3f;
  sVar3 = std::vector<FilterSubList,_al::allocator<FilterSubList,_8UL>_>::size
                    ((vector<FilterSubList,_al::allocator<FilterSubList,_8UL>_> *)(in_RDI + 0x150));
  if (uVar2 < sVar3) {
    pvVar4 = std::vector<FilterSubList,_al::allocator<FilterSubList,_8UL>_>::operator[]
                       ((vector<FilterSubList,_al::allocator<FilterSubList,_8UL>_> *)
                        (in_RDI + 0x150),uVar2);
    uVar2 = pvVar4->FreeMask;
    uVar5 = operator____u64(1);
    if ((uVar2 & uVar5 << (sbyte)uVar1) == 0) {
      local_8 = pvVar4->Filters + uVar1;
    }
    else {
      local_8 = (ALfilter *)0x0;
    }
  }
  else {
    local_8 = (ALfilter *)0x0;
  }
  return local_8;
}

Assistant:

inline ALfilter *LookupFilter(ALCdevice *device, ALuint id) noexcept
{
    const size_t lidx{(id-1) >> 6};
    const ALuint slidx{(id-1) & 0x3f};

    if UNLIKELY(lidx >= device->FilterList.size())
        return nullptr;
    FilterSubList &sublist = device->FilterList[lidx];
    if UNLIKELY(sublist.FreeMask & (1_u64 << slidx))
        return nullptr;
    return sublist.Filters + slidx;
}